

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O1

bool __thiscall zmq::router_t::xhas_out(router_t *this)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  
  bVar4 = true;
  if (this->_mandatory == true) {
    p_Var2 = (this->super_routing_socket_base_t)._out_pipes._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
    p_Var3 = &(this->super_routing_socket_base_t)._out_pipes._M_t._M_impl.super__Rb_tree_header;
    bVar4 = false;
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      do {
        bVar1 = pipe_t::check_hwm((pipe_t *)p_Var2[1]._M_right);
        bVar4 = (bool)(bVar1 | bVar4);
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
        if ((_Rb_tree_header *)p_Var2 == p_Var3) {
          return bVar4;
        }
      } while (bVar4 == false);
    }
  }
  return bVar4;
}

Assistant:

bool zmq::router_t::xhas_out ()
{
    //  In theory, ROUTER socket is always ready for writing (except when
    //  MANDATORY is set). Whether actual attempt to write succeeds depends
    //  on whitch pipe the message is going to be routed to.

    if (!_mandatory)
        return true;

    return any_of_out_pipes (check_pipe_hwm);
}